

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O3

void __thiscall refc<cg_box>::decrement(refc<cg_box> *this)

{
  int *piVar1;
  cg_box *pcVar2;
  
  piVar1 = this->count;
  if (*piVar1 == 1) {
    operator_delete(piVar1);
    pcVar2 = this->ptr;
    if ((pcVar2 != (cg_box *)0x0) && (pcVar2->data != (int *)0x0)) {
      operator_delete__(pcVar2->data);
    }
    operator_delete(pcVar2);
    return;
  }
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void decrement() {
        if (*count == 1) {
            delete count;
            delete ptr;
        } else {
            --*count;
        }
    }